

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

mpc_val_t * mpcf_escape_new(mpc_val_t *x,char *input,char **output)

{
  long lVar1;
  char cVar2;
  char *__s;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  char buff [2];
  char local_3a [2];
  size_t local_38;
  
  __s = (char *)calloc(1,1);
  cVar2 = *x;
  do {
    if (cVar2 == '\0') {
      return __s;
    }
    pcVar5 = *output;
    if (pcVar5 == (char *)0x0) {
LAB_00106213:
      sVar3 = strlen(__s);
      __s = (char *)realloc(__s,sVar3 + 2);
      local_3a[0] = *x;
      local_3a[1] = 0;
      pcVar5 = local_3a;
    }
    else {
      if (cVar2 == *input) {
        lVar6 = 0;
      }
      else {
        lVar4 = 0;
        do {
          pcVar5 = output[lVar4 + 1];
          if (pcVar5 == (char *)0x0) goto LAB_00106213;
          lVar6 = lVar4 + 1;
          lVar1 = lVar4 + 1;
          lVar4 = lVar6;
        } while (cVar2 != input[lVar1]);
      }
      local_38 = strlen(__s);
      sVar3 = strlen(pcVar5);
      __s = (char *)realloc(__s,local_38 + sVar3 + 1);
      pcVar5 = output[lVar6];
    }
    strcat(__s,pcVar5);
    cVar2 = *(char *)((long)x + 1);
    x = (mpc_val_t *)((long)x + 1);
  } while( true );
}

Assistant:

static mpc_val_t *mpcf_escape_new(mpc_val_t *x, const char *input, const char **output) {

  int i;
  int found;
  char buff[2];
  char *s = x;
  char *y = calloc(1, 1);

  while (*s) {

    i = 0;
    found = 0;

    while (output[i]) {
      if (*s == input[i]) {
        y = realloc(y, strlen(y) + strlen(output[i]) + 1);
        strcat(y, output[i]);
        found = 1;
        break;
      }
      i++;
    }

    if (!found) {
      y = realloc(y, strlen(y) + 2);
      buff[0] = *s; buff[1] = '\0';
      strcat(y, buff);
    }

    s++;
  }


  return y;
}